

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O3

String * Rml::StringUtilities::DecodeRml(String *__return_storage_ptr__,String *s)

{
  pointer pcVar1;
  long *plVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  char cVar8;
  char *pcVar9;
  char *end;
  String tmp;
  undefined4 local_84;
  String local_80;
  char *local_60;
  long *local_58 [2];
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (s->_M_string_length != 0) {
    pcVar9 = (char *)0x0;
    do {
      pcVar1 = (s->_M_dataplus)._M_p;
      if (pcVar9[(long)pcVar1] == '&') {
        bVar7 = pcVar9[(long)(pcVar1 + 1)];
        if (bVar7 < 0x67) {
          if (bVar7 == 0x23) {
            if (pcVar9[(long)(pcVar1 + 2)] == 'x') {
              lVar5 = 0;
              do {
                bVar7 = pcVar9[(long)(pcVar1 + lVar5 + 3)];
                if ((9 < (byte)(bVar7 - 0x30)) &&
                   ((0x25 < bVar7 - 0x41 ||
                    ((0x3f0000003fU >> ((ulong)(bVar7 - 0x41) & 0x3f) & 1) == 0)))) {
                  if (lVar5 == 0) goto LAB_00264b1c;
                  goto LAB_002649a0;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 != 8);
              bVar7 = pcVar9[(long)(pcVar1 + 0xb)];
              lVar5 = 8;
LAB_002649a0:
              iVar4 = (int)lVar5;
              if (bVar7 == 0x3b) {
                ::std::__cxx11::string::substr((ulong)local_58,(ulong)s);
                plVar2 = local_58[0];
                uVar3 = strtoul((char *)local_58[0],&local_60,0x10);
                uVar6 = uVar3 + 1;
                if (1 < uVar6) {
                  local_84 = (undefined4)uVar3;
                  ToUTF8_abi_cxx11_(&local_80,(StringUtilities *)&local_84,(Character *)0x1,iVar4);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_dataplus._M_p != &local_80.field_2) {
                    operator_delete(local_80._M_dataplus._M_p,
                                    local_80.field_2._M_allocated_capacity + 1);
                  }
                  pcVar9 = local_60 + (long)(pcVar9 + (4 - (long)plVar2));
                }
LAB_00264afa:
                if (local_58[0] != local_48) {
                  operator_delete(local_58[0],local_48[0] + 1);
                }
                if (1 < uVar6) goto LAB_00264b2f;
              }
            }
            else {
              lVar5 = 0;
              do {
                cVar8 = pcVar9[(long)(pcVar1 + lVar5 + 2)];
                if (9 < (byte)(cVar8 - 0x30U)) {
                  if (lVar5 == 0) goto LAB_00264b1c;
                  goto LAB_00264a6d;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 != 8);
              cVar8 = pcVar9[(long)(pcVar1 + 10)];
              lVar5 = 8;
LAB_00264a6d:
              iVar4 = (int)lVar5;
              if (cVar8 == ';') {
                ::std::__cxx11::string::substr((ulong)local_58,(ulong)s);
                plVar2 = local_58[0];
                uVar3 = strtoul((char *)local_58[0],&local_60,10);
                uVar6 = uVar3 + 1;
                if (1 < uVar6) {
                  local_84 = (undefined4)uVar3;
                  ToUTF8_abi_cxx11_(&local_80,(StringUtilities *)&local_84,(Character *)0x1,iVar4);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_dataplus._M_p != &local_80.field_2) {
                    operator_delete(local_80._M_dataplus._M_p,
                                    local_80.field_2._M_allocated_capacity + 1);
                  }
                  pcVar9 = local_60 + (long)(pcVar9 + (3 - (long)plVar2));
                }
                goto LAB_00264afa;
              }
            }
          }
          else if ((((bVar7 == 0x61) && (pcVar9[(long)(pcVar1 + 2)] == 'm')) &&
                   (pcVar9[(long)(pcVar1 + 3)] == 'p')) && (pcVar9[(long)(pcVar1 + 4)] == ';')) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            pcVar9 = pcVar9 + 5;
            goto LAB_00264b2f;
          }
          goto LAB_00264b1c;
        }
        if (bVar7 != 0x67) {
          if (bVar7 == 0x71) {
            if (((pcVar9[(long)(pcVar1 + 2)] == 'u') && (pcVar9[(long)(pcVar1 + 3)] == 'o')) &&
               ((pcVar9[(long)(pcVar1 + 4)] == 't' && (pcVar9[(long)(pcVar1 + 5)] == ';')))) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              pcVar9 = pcVar9 + 6;
              goto LAB_00264b2f;
            }
          }
          else if (((bVar7 == 0x6c) && (pcVar9[(long)(pcVar1 + 2)] == 't')) &&
                  (pcVar9[(long)(pcVar1 + 3)] == ';')) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            goto LAB_002648fd;
          }
          goto LAB_00264b1c;
        }
        if ((pcVar9[(long)(pcVar1 + 2)] != 't') || (pcVar9[(long)(pcVar1 + 3)] != ';'))
        goto LAB_00264b1c;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_002648fd:
        pcVar9 = pcVar9 + 4;
      }
      else {
LAB_00264b1c:
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        pcVar9 = pcVar9 + 1;
      }
LAB_00264b2f:
    } while (pcVar9 < (char *)s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::DecodeRml(const String& s)
{
	String result;
	result.reserve(s.size());
	for (size_t i = 0; i < s.size();)
	{
		if (s[i] == '&')
		{
			if (s[i + 1] == 'l' && s[i + 2] == 't' && s[i + 3] == ';')
			{
				result += "<";
				i += 4;
				continue;
			}
			else if (s[i + 1] == 'g' && s[i + 2] == 't' && s[i + 3] == ';')
			{
				result += ">";
				i += 4;
				continue;
			}
			else if (s[i + 1] == 'a' && s[i + 2] == 'm' && s[i + 3] == 'p' && s[i + 4] == ';')
			{
				result += "&";
				i += 5;
				continue;
			}
			else if (s[i + 1] == 'q' && s[i + 2] == 'u' && s[i + 3] == 'o' && s[i + 4] == 't' && s[i + 5] == ';')
			{
				result += "\"";
				i += 6;
				continue;
			}
			else if (s[i + 1] == '#')
			{
				size_t start = i + 2;
				if (s[i + 2] == 'x')
				{
					start++;
					size_t j = 0;
					for (; j < 8; j++)
					{
						const auto& c = s[start + j];
						if (!((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')))
							break;
					}

					if (j > 0 && s[start + j] == ';')
					{
						String tmp = s.substr(start, j);
						const char* begin = tmp.c_str();
						char* end;
						unsigned long code_point = strtoul(begin, &end, 16);
						if (code_point != 0 && code_point != ULONG_MAX)
						{
							result += ToUTF8(static_cast<Character>(code_point));
							i = start + (end - begin) + 1;
							continue;
						}
					}
				}
				else
				{
					size_t j = 0;
					for (; j < 8; j++)
					{
						const auto& c = s[start + j];
						if (!(c >= '0' && c <= '9'))
							break;
					}

					if (j > 0 && s[start + j] == ';')
					{
						String tmp = s.substr(start, j);
						const char* begin = tmp.c_str();
						char* end;
						unsigned long code_point = strtoul(begin, &end, 10);
						if (code_point != 0 && code_point != ULONG_MAX)
						{
							result += ToUTF8(static_cast<Character>(code_point));
							i = start + (end - begin) + 1;
							continue;
						}
					}
				}
			}
		}
		result += s[i];
		i += 1;
	}
	return result;
}